

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorData(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
                void *pUserData)

{
  int rc;
  lhcell *pCell;
  lhash_kv_cursor *pCur;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  unqlite_kv_cursor *pCursor_local;
  
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    pCursor_local._4_4_ = lhConsumeCellData((lhcell *)pCursor[2].pStore,xConsumer,pUserData);
  }
  else {
    pCursor_local._4_4_ = -9;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorData(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	/* Consume the data */
	rc = lhConsumeCellData(pCell,xConsumer,pUserData);
	return rc;
}